

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 *this;
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_07;
  initializer_list<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __l_08;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>
  __l_09;
  initializer_list<Person> __l_10;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  Person *pPStack_20aa0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  *ppStack_20a88;
  vector<int,_std::allocator<int>_> *pvStack_20a70;
  vector<int,_std::allocator<int>_> *pvStack_20a58;
  vector<int,_std::allocator<int>_> *pvStack_20a40;
  vector<int,_std::allocator<int>_> *pvStack_20a28;
  serialization_error *err;
  Customize c2;
  undefined1 auStack_208d0 [8];
  Customize c;
  xml_iarchive xml_ia;
  AddressBook ab3;
  string asStack_10740 [8];
  string xml_str;
  xml_oarchive xml_oa;
  json_iarchive json_ia;
  AddressBook ab2;
  json_oarchive json_oa;
  allocator<std::vector<int,_std::allocator<int>_>_> local_4bf;
  undefined1 local_4be;
  allocator<int> local_4bd;
  int local_4bc [3];
  iterator local_4b0;
  size_type local_4a8;
  vector<int,_std::allocator<int>_> *local_4a0;
  vector<int,_std::allocator<int>_> local_498;
  undefined1 local_480 [18];
  undefined1 local_46e;
  allocator<int> local_46d;
  int local_46c [3];
  iterator local_460;
  size_type local_458;
  allocator<int> local_44d;
  int local_44c [3];
  iterator local_440;
  size_type local_438;
  vector<int,_std::allocator<int>_> *local_430;
  vector<int,_std::allocator<int>_> local_428;
  vector<int,_std::allocator<int>_> local_410;
  undefined1 local_3f8 [18];
  undefined1 local_3e6;
  allocator<int> local_3e5;
  int local_3e4 [3];
  iterator local_3d8;
  size_type local_3d0;
  allocator<int> local_3c5;
  int local_3c4 [3];
  iterator local_3b8;
  size_type local_3b0;
  allocator<int> local_3a5;
  int local_3a4 [3];
  iterator local_398;
  size_type local_390;
  vector<int,_std::allocator<int>_> *local_388;
  vector<int,_std::allocator<int>_> local_380;
  vector<int,_std::allocator<int>_> local_368;
  vector<int,_std::allocator<int>_> local_350;
  vector<int,_std::allocator<int>_> local_338;
  vector<int,_std::allocator<int>_> local_320;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_308;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2f0;
  undefined1 local_2d8 [21];
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2c3;
  undefined1 local_2c2;
  allocator<char> local_2c1;
  Person local_2c0;
  allocator<char> local_291;
  Person local_290;
  allocator<char> local_261;
  Person local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  *local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  local_1a0;
  iterator local_158;
  size_type local_150;
  allocator<Person> local_148 [2];
  allocator<char> local_146;
  allocator<char> local_145 [20];
  allocator<char> local_131;
  Person *local_130;
  Person local_128;
  string local_100 [32];
  undefined4 local_e0;
  string local_d8 [32];
  undefined4 local_b8;
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  AddressBook ab;
  char **argv_local;
  int argc_local;
  
  local_148[1] = (allocator<Person>)0x1;
  local_130 = &local_128;
  ab.vectorTest.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"aaaaaaa",&local_131);
  local_128.age = 0xc;
  local_130 = (Person *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"qwasasdq",local_145);
  local_e0 = 0x573b;
  local_130 = (Person *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"12qweqweqweqwe",&local_146);
  local_b8 = 0x1e0f3;
  local_148[1] = (allocator<Person>)0x0;
  local_b0 = &local_128;
  local_a8 = 3;
  std::allocator<Person>::allocator(local_148);
  __l_10._M_len = local_a8;
  __l_10._M_array = local_b0;
  std::vector<Person,_std::allocator<Person>_>::vector
            ((vector<Person,_std::allocator<Person>_> *)local_a0,__l_10,local_148);
  json_oa.writer_.hasRoot_ = true;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_char_(&)[11],_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ab.people.super__Vector_base<Person,_std::allocator<Person>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(char (*) [11])"opt string");
  json_oa.writer_._61_1_ = 1;
  local_2c2 = 1;
  local_238 = &local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"a",&local_261);
  local_260.age = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  ::pair<const_char_(&)[2],_true>(&local_230,(char (*) [2])0x14a101,&local_260);
  local_238 = &local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"b",&local_291);
  local_290.age = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  ::pair<const_char_(&)[2],_true>(&local_1e8,(char (*) [2])0x14dd23,&local_290);
  local_238 = &local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"c",&local_2c1);
  local_2c0.age = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  ::pair<const_char_(&)[2],_true>(&local_1a0,(char (*) [2])"c",&local_2c0);
  local_2c2 = 0;
  local_158 = &local_230;
  local_150 = 3;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>
               *)(local_2d8 + 0x14));
  __l_09._M_len = local_150;
  __l_09._M_array = local_158;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
         *)&ab.opt.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged,__l_09,&local_2c3,
        (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>
         *)(local_2d8 + 0x14));
  json_oa.writer_._62_1_ = 1;
  local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_320;
  local_3e6 = 1;
  local_3a4[0] = 1;
  local_3a4[1] = 2;
  local_3a4[2] = 3;
  local_398 = local_3a4;
  local_390 = 3;
  local_388 = &local_380;
  std::allocator<int>::allocator(&local_3a5);
  __l_06._M_len = local_390;
  __l_06._M_array = local_398;
  std::vector<int,_std::allocator<int>_>::vector(&local_380,__l_06,&local_3a5);
  local_3c4[0] = 4;
  local_3c4[1] = 5;
  local_3c4[2] = 6;
  local_3b8 = local_3c4;
  local_3b0 = 3;
  local_388 = &local_368;
  std::allocator<int>::allocator(&local_3c5);
  __l_05._M_len = local_3b0;
  __l_05._M_array = local_3b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_368,__l_05,&local_3c5);
  local_3e4[0] = 7;
  local_3e4[1] = 8;
  local_3e4[2] = 9;
  local_3d8 = local_3e4;
  local_3d0 = 3;
  local_388 = &local_350;
  std::allocator<int>::allocator(&local_3e5);
  __l_04._M_len = local_3d0;
  __l_04._M_array = local_3d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_350,__l_04,&local_3e5);
  local_3e6 = 0;
  local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_380;
  local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x3;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_3f8 + 0x11));
  __l_07._M_len =
       (size_type)
       local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __l_07._M_array =
       (iterator)
       local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_320,__l_07,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)(local_3f8 + 0x11));
  local_46e = 1;
  local_44c[0] = 0xb;
  local_44c[1] = 0xc;
  local_44c[2] = 0xd;
  local_440 = local_44c;
  local_438 = 3;
  local_430 = &local_428;
  local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_308;
  std::allocator<int>::allocator(&local_44d);
  __l_02._M_len = local_438;
  __l_02._M_array = local_440;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l_02,&local_44d);
  local_46c[0] = 0xe;
  local_46c[1] = 0xf;
  local_46c[2] = 0x10;
  local_460 = local_46c;
  local_458 = 3;
  local_430 = &local_410;
  std::allocator<int>::allocator(&local_46d);
  __l_01._M_len = local_458;
  __l_01._M_array = local_460;
  std::vector<int,_std::allocator<int>_>::vector(&local_410,__l_01,&local_46d);
  local_46e = 0;
  local_3f8._0_8_ = &local_428;
  local_3f8._8_8_ = (pointer)0x2;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_480 + 0x11));
  __l_03._M_len = local_3f8._8_8_;
  __l_03._M_array = (iterator)local_3f8._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_308,__l_03,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)(local_480 + 0x11));
  local_4be = 1;
  local_4bc[0] = 0x15;
  local_4bc[1] = 0x16;
  local_4bc[2] = 0x17;
  local_4b0 = local_4bc;
  local_4a8 = 3;
  local_4a0 = &local_498;
  local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_2f0;
  std::allocator<int>::allocator(&local_4bd);
  __l._M_len = local_4a8;
  __l._M_array = local_4b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_498,__l,&local_4bd);
  local_4be = 0;
  local_480._0_8_ = &local_498;
  local_480._8_8_ = (pointer)0x1;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_4bf);
  __l_00._M_len = local_480._8_8_;
  __l_00._M_array = (iterator)local_480._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_2f0,__l_00,&local_4bf);
  local_2d8._0_8_ = &local_320;
  local_2d8._8_8_ = (pointer)0x3;
  this = &json_oa.writer_.field_0x3f;
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
               *)this);
  __l_08._M_len = local_2d8._8_8_;
  __l_08._M_array = (iterator)local_2d8._0_8_;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)&ab.mapTest._M_t._M_impl.super__Rb_tree_header._M_node_count,__l_08,
           (allocator_type *)this);
  json_oa.writer_._62_1_ = 0;
  json_oa.writer_._61_1_ = 0;
  json_oa.writer_.hasRoot_ = false;
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)&json_oa.writer_.field_0x3f);
  pvStack_20a28 = (vector<int,_std::allocator<int>_> *)local_2d8;
  do {
    pvStack_20a28 = pvStack_20a28 + -1;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)pvStack_20a28);
  } while (pvStack_20a28 != &local_320);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_4bf);
  pvStack_20a40 = (vector<int,_std::allocator<int>_> *)local_480;
  do {
    pvStack_20a40 = pvStack_20a40 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(pvStack_20a40);
  } while (pvStack_20a40 != &local_498);
  std::allocator<int>::~allocator(&local_4bd);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_480 + 0x11));
  pvStack_20a58 = (vector<int,_std::allocator<int>_> *)local_3f8;
  do {
    pvStack_20a58 = pvStack_20a58 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(pvStack_20a58);
  } while (pvStack_20a58 != &local_428);
  std::allocator<int>::~allocator(&local_46d);
  std::allocator<int>::~allocator(&local_44d);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_3f8 + 0x11));
  pvStack_20a70 = &local_338;
  do {
    pvStack_20a70 = pvStack_20a70 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(pvStack_20a70);
  } while (pvStack_20a70 != &local_380);
  std::allocator<int>::~allocator(&local_3e5);
  std::allocator<int>::~allocator(&local_3c5);
  std::allocator<int>::~allocator(&local_3a5);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>
                *)(local_2d8 + 0x14));
  ppStack_20a88 =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
        *)&local_158;
  do {
    ppStack_20a88 = ppStack_20a88 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
    ::~pair(ppStack_20a88);
  } while (ppStack_20a88 != &local_230);
  Person::~Person(&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  Person::~Person(&local_290);
  std::allocator<char>::~allocator(&local_291);
  Person::~Person(&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<Person>::~allocator(local_148);
  pPStack_20aa0 = (Person *)&local_b0;
  do {
    pPStack_20aa0 = pPStack_20aa0 + -1;
    Person::~Person(pPStack_20aa0);
  } while (pPStack_20aa0 != &local_128);
  std::allocator<char>::~allocator(&local_146);
  std::allocator<char>::~allocator(local_145);
  std::allocator<char>::~allocator(&local_131);
  serialization::json_oarchive::json_oarchive
            ((json_oarchive *)
             &ab2.vectorTest.
              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  serialization::serialize<serialization::json_oarchive,AddressBook>
            ((json_oarchive *)
             &ab2.vectorTest.
              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(AddressBook *)local_a0);
  poVar2 = std::operator<<((ostream *)&std::cout,"json serilize result: ");
  pcVar3 = serialization::json_oarchive::data
                     ((json_oarchive *)
                      &ab2.vectorTest.
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  AddressBook::AddressBook
            ((AddressBook *)
             ((long)&json_ia.stack_.c.
                     super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  serialization::json_iarchive::json_iarchive((json_iarchive *)((long)&xml_oa.str_.field_2 + 8));
  pcVar3 = serialization::json_oarchive::data
                     ((json_oarchive *)
                      &ab2.vectorTest.
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  serialization::json_iarchive::load_data((json_iarchive *)((long)&xml_oa.str_.field_2 + 8),pcVar3);
  serialization::unserialize<serialization::json_iarchive,AddressBook>
            ((json_iarchive *)((long)&xml_oa.str_.field_2 + 8),
             (AddressBook *)
             ((long)&json_ia.stack_.c.
                     super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  poVar2 = std::operator<<((ostream *)&std::cout,"json unserilize result: ");
  bVar1 = AddressBook::operator==
                    ((AddressBook *)local_a0,
                     (AddressBook *)
                     ((long)&json_ia.stack_.c.
                             super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  pcVar3 = "fail";
  if (bVar1) {
    pcVar3 = "success";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  serialization::xml_oarchive::xml_oarchive((xml_oarchive *)((long)&xml_str.field_2 + 8));
  serialization::serialize<serialization::xml_oarchive,AddressBook>
            ((xml_oarchive *)((long)&xml_str.field_2 + 8),(AddressBook *)local_a0);
  pcVar3 = serialization::xml_oarchive::data((xml_oarchive *)((long)&xml_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_10740,pcVar3,
             (allocator<char> *)
             ((long)&ab3.vectorTest.
                     super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ab3.vectorTest.
                     super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  poVar2 = std::operator<<((ostream *)&std::cout,"xml serilize result: ");
  poVar2 = std::operator<<(poVar2,asStack_10740);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  AddressBook::AddressBook
            ((AddressBook *)
             ((long)&xml_ia.stack_.c.
                     super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  serialization::xml_iarchive::xml_iarchive((xml_iarchive *)((long)&c.b.field_2 + 8));
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)asStack_10740);
  serialization::xml_iarchive::load_data((xml_iarchive *)((long)&c.b.field_2 + 8),pcVar3);
  serialization::unserialize<serialization::xml_iarchive,AddressBook>
            ((xml_iarchive *)((long)&c.b.field_2 + 8),
             (AddressBook *)
             ((long)&xml_ia.stack_.c.
                     super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  poVar2 = std::operator<<((ostream *)&std::cout,"xml unserilize result: ");
  bVar1 = AddressBook::operator==
                    ((AddressBook *)local_a0,
                     (AddressBook *)
                     ((long)&xml_ia.stack_.c.
                             super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  pcVar3 = "fail";
  if (bVar1) {
    pcVar3 = "success";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  auStack_208d0._0_4_ = 0x7b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c,"456",(allocator<char> *)(c2.b.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(c2.b.field_2._M_local_buf + 0xf));
  Customize::Customize((Customize *)&err);
  serialization::serialize<serialization::json_oarchive,Customize>
            ((json_oarchive *)
             &ab2.vectorTest.
              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Customize *)auStack_208d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"customize json serilize result: ");
  pcVar3 = serialization::json_oarchive::data
                     ((json_oarchive *)
                      &ab2.vectorTest.
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar3 = serialization::json_oarchive::data
                     ((json_oarchive *)
                      &ab2.vectorTest.
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  serialization::json_iarchive::load_data((json_iarchive *)((long)&xml_oa.str_.field_2 + 8),pcVar3);
  serialization::unserialize<serialization::json_iarchive,Customize>
            ((json_iarchive *)((long)&xml_oa.str_.field_2 + 8),(Customize *)&err);
  poVar2 = std::operator<<((ostream *)&std::cout,"customize json unserilize result: ");
  bVar1 = Customize::operator==((Customize *)auStack_208d0,(Customize *)&err);
  pcVar3 = "fail";
  if (bVar1) {
    pcVar3 = "success";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Customize::~Customize((Customize *)&err);
  Customize::~Customize((Customize *)auStack_208d0);
  serialization::xml_iarchive::~xml_iarchive((xml_iarchive *)((long)&c.b.field_2 + 8));
  AddressBook::~AddressBook
            ((AddressBook *)
             ((long)&xml_ia.stack_.c.
                     super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  std::__cxx11::string::~string(asStack_10740);
  serialization::xml_oarchive::~xml_oarchive((xml_oarchive *)((long)&xml_str.field_2 + 8));
  serialization::json_iarchive::~json_iarchive((json_iarchive *)((long)&xml_oa.str_.field_2 + 8));
  AddressBook::~AddressBook
            ((AddressBook *)
             ((long)&json_ia.stack_.c.
                     super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  serialization::json_oarchive::~json_oarchive
            ((json_oarchive *)
             &ab2.vectorTest.
              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  AddressBook::~AddressBook((AddressBook *)local_a0);
  return 0;
}

Assistant:

int main(int argc, char * argv[])
{
    try
    {
        AddressBook ab = {
            {
                {"aaaaaaa", 12},
                {"qwasasdq", 22331},
                {"12qweqweqweqwe", 123123}
            },
            "opt string",
            {
                {"a", {"a", 1} },
                {"b", {"b", 2} },
                {"c", {"c", 3} },
            },
            {
                { {1, 2, 3}, {4, 5, 6}, {7, 8, 9} },
                { {11, 12, 13}, {14, 15, 16} },
                { {21, 22, 23} },
            }
        };

        // json serialize
        serialization::json_oarchive json_oa;
        serialization::serialize(json_oa, ab);
        std::cout << "json serilize result: " << json_oa.data() << std::endl;

        // json unserialize
        AddressBook ab2;
        serialization::json_iarchive json_ia;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, ab2);
        std::cout << "json unserilize result: " << (ab == ab2 ? "success" : "fail") << std::endl;

        // xml serialize
        serialization::xml_oarchive xml_oa;
        serialization::serialize(xml_oa, ab);
        std::string xml_str = xml_oa.data();
        std::cout << "xml serilize result: " << xml_str << std::endl;

        // xml unserialize
        AddressBook ab3;
        serialization::xml_iarchive xml_ia;
        xml_ia.load_data(&xml_str[0]);
        serialization::unserialize(xml_ia, ab3);
        std::cout << "xml unserilize result: " << (ab == ab3 ? "success" : "fail") << std::endl;

        //test coustomize 
        Customize c{123, "456"}, c2;
        serialization::serialize(json_oa, c);
        std::cout << "customize json serilize result: " << json_oa.data() << std::endl;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, c2);
        std::cout << "customize json unserilize result: " << (c == c2 ? "success" : "fail") << std::endl;

    }
    catch (serialization::serialization_error & err)
    {
        std::cout << err.where() << ":" << err.what() << std::endl;
    }
}